

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestGroupStats::TestGroupStats
          (TestGroupStats *this,GroupInfo *_groupInfo,Totals *_totals,bool _aborting)

{
  bool _aborting_local;
  Totals *_totals_local;
  GroupInfo *_groupInfo_local;
  TestGroupStats *this_local;
  
  this->_vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_00270cb0;
  GroupInfo::GroupInfo(&this->groupInfo,_groupInfo);
  memcpy(&this->totals,_totals,0x38);
  this->aborting = _aborting;
  return;
}

Assistant:

TestGroupStats::TestGroupStats( GroupInfo const& _groupInfo,
                                    Totals const& _totals,
                                    bool _aborting )
    :   groupInfo( _groupInfo ),
        totals( _totals ),
        aborting( _aborting )
    {}